

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluInitTruthTables(void)

{
  byte bVar1;
  word wVar2;
  int local_10;
  int local_c;
  int k;
  int i;
  
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x400; local_10 = local_10 + 1) {
      TruthAll[local_c][local_10] = Truth6[local_c];
    }
  }
  for (local_c = 6; local_c < 0x10; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x400; local_10 = local_10 + 1) {
      bVar1 = (char)local_c - 6U & 0x1f;
      wVar2 = (word)(uint)(0 >> bVar1);
      if ((local_10 >> bVar1 & 1U) != 0) {
        wVar2 = 0xffffffffffffffff;
      }
      TruthAll[local_c][local_10] = wVar2;
    }
  }
  return;
}

Assistant:

void If_CluInitTruthTables()
{
    int i, k;
    assert( CLU_VAR_MAX <= 16 );
    for ( i = 0; i < 6; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = Truth6[i];
    for ( i = 6; i < CLU_VAR_MAX; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;

//    Extra_PrintHex( stdout, TruthAll[6], 8 ); printf( "\n" );
//    Extra_PrintHex( stdout, TruthAll[7], 8 ); printf( "\n" );
}